

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O1

mchunkptr try_realloc_chunk(mstate m,mchunkptr p,size_t nb,int can_move)

{
  tbinptr pmVar1;
  byte *pbVar2;
  uint uVar3;
  ulong uVar4;
  malloc_tree_chunk *pmVar5;
  malloc_tree_chunk *pmVar6;
  byte bVar7;
  char *pcVar8;
  mchunkptr p_00;
  ulong uVar9;
  malloc_tree_chunk **ppmVar10;
  uint uVar11;
  size_t psize;
  mchunkptr pmVar12;
  tbinptr pmVar13;
  size_t newsize;
  
  if (m < _gm_.least_addr) goto LAB_00105cb2;
  uVar9 = m->dvsize;
  uVar11 = (uint)uVar9;
  if (((uVar11 & 3) == 1) || (pmVar12 = (mchunkptr)(uVar9 & 0xfffffffffffffff8), (long)pmVar12 < 1))
  goto LAB_00105cb2;
  pmVar1 = (tbinptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&pmVar12[-3].bk)
  ;
  uVar4 = pmVar1->head;
  if ((uVar4 & 1) == 0) goto LAB_00105cb2;
  if ((uVar9 & 3) == 0) {
    if (p < (mchunkptr)0x100) {
      return (mchunkptr)0x0;
    }
    if (pmVar12 < &p->head) {
      return (mchunkptr)0x0;
    }
    if (mparams.granularity * 2 < (ulong)((long)pmVar12 - (long)p)) {
      return (mchunkptr)0x0;
    }
    return (mchunkptr)m;
  }
  p_00 = (mchunkptr)((long)pmVar12 - (long)p);
  if (p <= pmVar12) {
    if (p_00 < (mchunkptr)&DAT_00000020) {
      return (mchunkptr)m;
    }
    psize = (ulong)(uVar11 & 1) | (ulong)p | 2;
    m->dvsize = psize;
    *(ulong *)((long)&m->dvsize + (long)p) = (ulong)p_00 | 3;
    *(byte *)&pmVar1->head = (byte)pmVar1->head | 1;
    goto LAB_00105a80;
  }
  if (pmVar1 == (tbinptr)_gm_.top) {
    pmVar12 = (mchunkptr)((long)&pmVar12->prev_foot + _gm_.topsize);
    uVar9 = (long)pmVar12 - (long)p;
    if (pmVar12 < p || uVar9 == 0) {
      return (mchunkptr)0x0;
    }
    m->dvsize = (ulong)(uVar11 & 1) | (ulong)p | 2;
    *(ulong *)((long)&m->dvsize + (long)p) = uVar9 | 1;
    _gm_.topsize = uVar9;
    _gm_.top = (mchunkptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk)
    ;
    return (mchunkptr)m;
  }
  if (pmVar1 == (tbinptr)_gm_.dv) {
    pmVar12 = (mchunkptr)((long)&pmVar12->prev_foot + _gm_.dvsize);
    uVar9 = (long)pmVar12 - (long)p;
    if (pmVar12 < p) {
      return (mchunkptr)0x0;
    }
    if (uVar9 < 0x20) {
      m->dvsize = (ulong)(uVar11 & 1) | (ulong)pmVar12 | 2;
      pbVar2 = (byte *)((long)&m->dvsize + (long)pmVar12);
      *pbVar2 = *pbVar2 | 1;
      _gm_.dvsize = 0;
      _gm_.dv = (mchunkptr)0x0;
      return (mchunkptr)m;
    }
    m->dvsize = (ulong)(uVar11 & 1) | (ulong)p | 2;
    *(ulong *)((long)&m->dvsize + (long)p) = uVar9 | 1;
    *(ulong *)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&pmVar12[-3].bk) =
         uVar9;
    pbVar2 = (byte *)((long)&m->dvsize + (long)pmVar12);
    *pbVar2 = *pbVar2 & 0xfe;
    _gm_.dvsize = uVar9;
    _gm_.dv = (mchunkptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk);
    return (mchunkptr)m;
  }
  if ((uVar4 & 2) != 0) {
    return (mchunkptr)0x0;
  }
  pmVar12 = (mchunkptr)((long)&pmVar12->prev_foot + (uVar4 & 0xfffffffffffffff8));
  p_00 = (mchunkptr)((long)pmVar12 - (long)p);
  if (pmVar12 < p) {
    return (mchunkptr)0x0;
  }
  if (0xff < uVar4) {
    pmVar13 = pmVar1->bk;
    pmVar5 = pmVar1->parent;
    if (pmVar13 == pmVar1) {
      pmVar13 = pmVar1->child[1];
      if (pmVar13 != (tbinptr)0x0) {
        ppmVar10 = pmVar1->child + 1;
LAB_00105baa:
        do {
          if (pmVar13->child[1] == (malloc_tree_chunk *)0x0) {
            if (pmVar13->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00105bbe;
            ppmVar10 = pmVar13->child;
          }
          else {
            ppmVar10 = pmVar13->child + 1;
          }
          pmVar13 = *ppmVar10;
        } while( true );
      }
      pmVar13 = pmVar1->child[0];
      if (pmVar13 != (tbinptr)0x0) {
        ppmVar10 = pmVar1->child;
        goto LAB_00105baa;
      }
      pmVar13 = (tbinptr)0x0;
    }
    else {
      pmVar6 = pmVar1->fd;
      if (((pmVar6 < _gm_.least_addr) || (pmVar6->bk != pmVar1)) || (pmVar13->fd != pmVar1))
      goto LAB_00105cb2;
      pmVar6->bk = pmVar13;
      pmVar13->fd = pmVar6;
    }
    goto LAB_00105bce;
  }
  pmVar5 = pmVar1->fd;
  pmVar6 = pmVar1->bk;
  if ((pmVar5 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar4 >> 3) * 2)) &&
     ((pmVar5 < _gm_.least_addr || (pmVar5->bk != pmVar1)))) goto LAB_00105cb2;
  if (pmVar6 == pmVar5) {
    bVar7 = (byte)(uVar4 >> 3) & 0x1f;
    _gm_.smallmap = _gm_.smallmap & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
  }
  else {
    if ((pmVar6 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar4 >> 3) * 2)) &&
       ((pmVar6 < _gm_.least_addr || (pmVar6->fd != pmVar1)))) goto LAB_00105cb2;
    pmVar5->bk = pmVar6;
    pmVar6->fd = pmVar5;
  }
  goto LAB_00105c69;
code_r0x00105bbe:
  if (ppmVar10 < _gm_.least_addr) goto LAB_00105cb2;
  *ppmVar10 = (malloc_tree_chunk *)0x0;
LAB_00105bce:
  if (pmVar5 != (malloc_tree_chunk *)0x0) {
    uVar3 = pmVar1->index;
    if (pmVar1 == _gm_.treebins[uVar3]) {
      _gm_.treebins[uVar3] = pmVar13;
      if (pmVar13 == (tbinptr)0x0) {
        bVar7 = (byte)uVar3 & 0x1f;
        _gm_.treemap = _gm_.treemap & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
        goto LAB_00105c28;
      }
    }
    else {
      if (pmVar5 < _gm_.least_addr) goto LAB_00105cb2;
      if (pmVar5->child[0] == pmVar1) {
        pmVar5->child[0] = pmVar13;
      }
      else {
        pmVar5->child[1] = pmVar13;
      }
LAB_00105c28:
      if (pmVar13 == (tbinptr)0x0) goto LAB_00105c69;
    }
    pcVar8 = _gm_.least_addr;
    if (pmVar13 < _gm_.least_addr) {
LAB_00105cb2:
      abort();
    }
    pmVar13->parent = pmVar5;
    pmVar5 = pmVar1->child[0];
    if (pmVar5 != (malloc_tree_chunk *)0x0) {
      if (pmVar5 < pcVar8) goto LAB_00105cb2;
      pmVar13->child[0] = pmVar5;
      pmVar5->parent = pmVar13;
    }
    pmVar5 = pmVar1->child[1];
    if (pmVar5 != (malloc_tree_chunk *)0x0) {
      if (pmVar5 < pcVar8) goto LAB_00105cb2;
      pmVar13->child[1] = pmVar5;
      pmVar5->parent = pmVar13;
    }
  }
LAB_00105c69:
  if (p_00 < (mchunkptr)&DAT_00000020) {
    m->dvsize = (long)&pmVar12->prev_foot + (ulong)(uVar11 & 1) + 2;
    pbVar2 = (byte *)((long)&m->dvsize + (long)pmVar12);
    *pbVar2 = *pbVar2 | 1;
    return (mchunkptr)m;
  }
  psize = (ulong)(uVar11 & 1) | (ulong)p | 2;
  m->dvsize = psize;
  *(ulong *)((long)&m->dvsize + (long)p) = (ulong)p_00 | 3;
  pbVar2 = (byte *)((long)&m->dvsize + (long)pmVar12);
  *pbVar2 = *pbVar2 | 1;
LAB_00105a80:
  dispose_chunk((mstate)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk),
                p_00,psize);
  return (mchunkptr)m;
}

Assistant:

static mchunkptr try_realloc_chunk(mstate m, mchunkptr p, size_t nb,
                                   int can_move) {
  mchunkptr newp = 0;
  size_t oldsize = chunksize(p);
  mchunkptr next = chunk_plus_offset(p, oldsize);
  if (RTCHECK(ok_address(m, p) && ok_inuse(p) &&
              ok_next(p, next) && ok_pinuse(next))) {
    if (is_mmapped(p)) {
      newp = mmap_resize(m, p, nb, can_move);
    }
    else if (oldsize >= nb) {             /* already big enough */
      size_t rsize = oldsize - nb;
      if (rsize >= MIN_CHUNK_SIZE) {      /* split off remainder */
        mchunkptr r = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        set_inuse(m, r, rsize);
        dispose_chunk(m, r, rsize);
      }
      newp = p;
    }
    else if (next == m->top) {  /* extend into top */
      if (oldsize + m->topsize > nb) {
        size_t newsize = oldsize + m->topsize;
        size_t newtopsize = newsize - nb;
        mchunkptr newtop = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        newtop->head = newtopsize |PINUSE_BIT;
        m->top = newtop;
        m->topsize = newtopsize;
        newp = p;
      }
    }
    else if (next == m->dv) { /* extend into dv */
      size_t dvs = m->dvsize;
      if (oldsize + dvs >= nb) {
        size_t dsize = oldsize + dvs - nb;
        if (dsize >= MIN_CHUNK_SIZE) {
          mchunkptr r = chunk_plus_offset(p, nb);
          mchunkptr n = chunk_plus_offset(r, dsize);
          set_inuse(m, p, nb);
          set_size_and_pinuse_of_free_chunk(r, dsize);
          clear_pinuse(n);
          m->dvsize = dsize;
          m->dv = r;
        }
        else { /* exhaust dv */
          size_t newsize = oldsize + dvs;
          set_inuse(m, p, newsize);
          m->dvsize = 0;
          m->dv = 0;
        }
        newp = p;
      }
    }
    else if (!cinuse(next)) { /* extend into next free chunk */
      size_t nextsize = chunksize(next);
      if (oldsize + nextsize >= nb) {
        size_t rsize = oldsize + nextsize - nb;
        unlink_chunk(m, next, nextsize);
        if (rsize < MIN_CHUNK_SIZE) {
          size_t newsize = oldsize + nextsize;
          set_inuse(m, p, newsize);
        }
        else {
          mchunkptr r = chunk_plus_offset(p, nb);
          set_inuse(m, p, nb);
          set_inuse(m, r, rsize);
          dispose_chunk(m, r, rsize);
        }
        newp = p;
      }
    }
  }
  else {
    USAGE_ERROR_ACTION(m, chunk2mem(p));
  }
  return newp;
}